

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

bool __thiscall
QScrollerPrivate::releaseWhileDragging(QScrollerPrivate *this,QPointF *position,qint64 timestamp)

{
  bool bVar1;
  bool bVar2;
  QScroller *timestamp_00;
  QScrollerPropertiesPrivate *pQVar3;
  double *pdVar4;
  QDebug *pQVar5;
  QPointF *in_RDX;
  QScrollerPrivate *in_RSI;
  QScrollerPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar6;
  int signY;
  int signX;
  QScrollerPropertiesPrivate *sp;
  QScroller *q;
  QPointF ppm;
  QPointF deltaPixel;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QPointF *in_stack_fffffffffffffeb8;
  QLoggingCategory *cat;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffec0;
  QPointF *in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  QPointF *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  QPointF *in_stack_ffffffffffffff20;
  QPointF *in_stack_ffffffffffffff28;
  QPointF *in_stack_ffffffffffffff30;
  QScrollerPrivate *in_stack_ffffffffffffff38;
  State in_stack_ffffffffffffff44;
  QDebug local_b8;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QPointF local_98;
  QPointF local_88;
  double local_78;
  qreal local_70;
  double local_68;
  qreal local_60;
  QPointF local_58;
  QPointF local_48;
  QPointF local_38;
  QPointF local_28;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  timestamp_00 = q_func(in_RDI);
  pQVar3 = QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>
           ::data(&(in_RDI->properties).d);
  handleDrag(in_RSI,in_RDX,(qint64)timestamp_00);
  local_28.yp = -NAN;
  local_28.xp = -NAN;
  local_28 = ::operator-(in_stack_fffffffffffffec8,(QPointF *)in_stack_fffffffffffffec0);
  local_48 = QScroller::pixelPerMeter
                       ((QScroller *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  local_38 = operator/((QPointF *)in_RDI,
                       (QPointF *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  qVar6 = QPointF::manhattanLength(in_stack_fffffffffffffec8);
  if (pQVar3->dragStartDistance <= qVar6 && qVar6 != pQVar3->dragStartDistance) {
    in_stack_fffffffffffffed8 = &in_RDI->oldVelocity;
    QPointF::QPointF(&local_58,0.0,0.0);
    bVar1 = ::operator!=((QPointF *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    bVar2 = false;
    if (bVar1) {
      bVar2 = false;
      if ((pQVar3->acceleratingFlickMaximumTime != 0.0) ||
         (NAN(pQVar3->acceleratingFlickMaximumTime))) {
        bVar2 = (long)in_RDX - in_RDI->pressTimestamp <
                (long)(pQVar3->acceleratingFlickMaximumTime * 1000.0);
      }
    }
    if (bVar2) {
      in_stack_fffffffffffffef4 = 0;
      in_stack_fffffffffffffef0 = 0;
      qVar6 = QPointF::x(&in_RDI->releaseVelocity);
      if ((qVar6 != 0.0) || (NAN(qVar6))) {
        qVar6 = QPointF::x(&in_RDI->releaseVelocity);
        in_stack_fffffffffffffed4 = (uint)(0.0 < qVar6);
        qVar6 = QPointF::x(&in_RDI->oldVelocity);
        in_stack_fffffffffffffef4 = -1;
        if (in_stack_fffffffffffffed4 == 0.0 < qVar6) {
          in_stack_fffffffffffffef4 = 1;
        }
      }
      qVar6 = QPointF::y(&in_RDI->releaseVelocity);
      if ((qVar6 != 0.0) || (NAN(qVar6))) {
        qVar6 = QPointF::y(&in_RDI->releaseVelocity);
        in_stack_fffffffffffffed0 = (uint)(0.0 < qVar6);
        qVar6 = QPointF::y(&in_RDI->oldVelocity);
        in_stack_fffffffffffffef0 = -1;
        if (in_stack_fffffffffffffed0 == 0.0 < qVar6) {
          in_stack_fffffffffffffef0 = 1;
        }
      }
      if (0 < in_stack_fffffffffffffef4) {
        in_stack_fffffffffffffec8 = &in_RDI->releaseVelocity;
        local_60 = -pQVar3->maximumVelocity;
        qVar6 = QPointF::x(&in_RDI->oldVelocity);
        local_68 = qVar6 * pQVar3->acceleratingFlickSpeedupFactor;
        pdVar4 = qBound<double>((double *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                &in_stack_fffffffffffffec8->xp,(double *)in_stack_fffffffffffffec0);
        QPointF::setX(in_stack_fffffffffffffec8,*pdVar4);
      }
      if (0 < in_stack_fffffffffffffef0) {
        in_stack_fffffffffffffec0 =
             (QLoggingCategoryMacroHolder<(QtMsgType)0> *)&in_RDI->releaseVelocity;
        local_70 = -pQVar3->maximumVelocity;
        qVar6 = QPointF::y(&in_RDI->oldVelocity);
        local_78 = qVar6 * pQVar3->acceleratingFlickSpeedupFactor;
        pdVar4 = qBound<double>((double *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                                &in_stack_fffffffffffffec8->xp,(double *)in_stack_fffffffffffffec0);
        QPointF::setY((QPointF *)in_stack_fffffffffffffec0,*pdVar4);
      }
    }
  }
  local_88.yp = -NAN;
  local_88.xp = -NAN;
  local_88 = QScroller::pixelPerMeter
                       ((QScroller *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  cat = (QLoggingCategory *)&in_RDI->releaseVelocity;
  local_98 = ::operator+(in_stack_fffffffffffffec8,(QPointF *)in_stack_fffffffffffffec0);
  createScrollingSegments
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcScroller();
  anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffec0,cat);
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
    anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa85e5e);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char *)in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
               (char *)cat,(char *)0xa85e74);
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffed8,(char *)in_RDX);
    QDebug::QDebug(&local_b8,pQVar5);
    ::operator<<((QDebug *)&local_b0,(QPointF *)&local_b8);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffed8,(char *)in_RDX);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffec0,(double)cat);
    pQVar5 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffed8,(char *)in_RDX);
    QDebug::QDebug(&local_a8,pQVar5);
    ::operator<<((QDebug *)&local_a0,(QPointF *)&local_a8);
    QDebug::~QDebug(&local_a0);
    QDebug::~QDebug(&local_a8);
    QDebug::~QDebug(&local_b0);
    QDebug::~QDebug(&local_b8);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffff40);
    local_10 = 0;
  }
  bVar2 = QList<QScrollerPrivate::ScrollSegment>::isEmpty
                    ((QList<QScrollerPrivate::ScrollSegment> *)0xa85f8d);
  if ((bVar2) &&
     (bVar2 = QList<QScrollerPrivate::ScrollSegment>::isEmpty
                        ((QList<QScrollerPrivate::ScrollSegment> *)0xa85fa4), bVar2)) {
    setState((QScrollerPrivate *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_ffffffffffffff44);
  }
  else {
    setState((QScrollerPrivate *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_ffffffffffffff44);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool QScrollerPrivate::releaseWhileDragging(const QPointF &position, qint64 timestamp)
{
    Q_Q(QScroller);
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    // handleDrag updates lastPosition, lastTimestamp and velocity
    handleDrag(position, timestamp);

    // check if we moved at all - this can happen if you stop a running
    // scroller with a press and release shortly afterwards
    QPointF deltaPixel = position - pressPosition;
    if (((deltaPixel / q->pixelPerMeter()).manhattanLength()) > sp->dragStartDistance) {

        // handle accelerating flicks
        if ((oldVelocity != QPointF(0, 0)) && sp->acceleratingFlickMaximumTime &&
            ((timestamp - pressTimestamp) < qint64(sp->acceleratingFlickMaximumTime * 1000))) {

            // - determine if the direction was changed
            int signX = 0, signY = 0;
            if (releaseVelocity.x())
                signX = (releaseVelocity.x() > 0) == (oldVelocity.x() > 0) ? 1 : -1;
            if (releaseVelocity.y())
                signY = (releaseVelocity.y() > 0) == (oldVelocity.y() > 0) ? 1 : -1;

            if (signX > 0)
                releaseVelocity.setX(qBound(-sp->maximumVelocity,
                                            oldVelocity.x() * sp->acceleratingFlickSpeedupFactor,
                                            sp->maximumVelocity));
            if (signY > 0)
                releaseVelocity.setY(qBound(-sp->maximumVelocity,
                                            oldVelocity.y() * sp->acceleratingFlickSpeedupFactor,
                                            sp->maximumVelocity));
        }
    }

    QPointF ppm = q->pixelPerMeter();
    createScrollingSegments(releaseVelocity, contentPosition + overshootPosition, ppm);

    qCDebug(lcScroller) << "QScroller::releaseWhileDragging() -- velocity:" << releaseVelocity
                        << "-- minimum velocity:" << sp->minimumVelocity << "overshoot" << overshootPosition;

    if (xSegments.isEmpty() && ySegments.isEmpty())
        setState(QScroller::Inactive);
    else
        setState(QScroller::Scrolling);

    return true;
}